

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ISceneNode.h
# Opt level: O3

matrix4 * __thiscall
irr::scene::ISceneNode::getRelativeTransformation(matrix4 *__return_storage_ptr__,ISceneNode *this)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  __return_storage_ptr__->M[7] = 0.0;
  __return_storage_ptr__->M[8] = 0.0;
  __return_storage_ptr__->M[9] = 0.0;
  __return_storage_ptr__->M[10] = 0.0;
  __return_storage_ptr__->M[3] = 0.0;
  __return_storage_ptr__->M[4] = 0.0;
  __return_storage_ptr__->M[5] = 0.0;
  __return_storage_ptr__->M[6] = 0.0;
  __return_storage_ptr__->M[0xb] = 0.0;
  __return_storage_ptr__->M[0xf] = 1.0;
  fVar1 = (this->RelativeRotation).Y;
  fVar11 = (this->RelativeRotation).Z;
  dVar4 = (double)((this->RelativeRotation).X * 0.017453292);
  dVar5 = cos(dVar4);
  dVar4 = sin(dVar4);
  dVar6 = (double)(fVar1 * 0.017453292);
  dVar7 = cos(dVar6);
  dVar6 = sin(dVar6);
  dVar8 = (double)(fVar11 * 0.017453292);
  dVar9 = cos(dVar8);
  dVar8 = sin(dVar8);
  fVar19 = -(float)dVar6;
  __return_storage_ptr__->M[2] = fVar19;
  fVar14 = (float)(dVar4 * dVar7);
  __return_storage_ptr__->M[6] = fVar14;
  fVar22 = (float)(dVar5 * dVar7);
  __return_storage_ptr__->M[10] = fVar22;
  fVar10 = (float)(dVar7 * dVar9);
  fVar12 = (float)(dVar7 * dVar8);
  *(ulong *)__return_storage_ptr__->M = CONCAT44(fVar12,fVar10);
  fVar17 = (float)(dVar4 * dVar6 * dVar9 + -dVar5 * dVar8);
  fVar18 = (float)(dVar4 * dVar6 * dVar8 + dVar9 * dVar5);
  fVar15 = (float)(dVar6 * dVar5 * dVar9 + dVar8 * dVar4);
  fVar16 = (float)(dVar6 * dVar5 * dVar8 + -dVar4 * dVar9);
  *(ulong *)(__return_storage_ptr__->M + 4) = CONCAT44(fVar18,fVar17);
  *(ulong *)(__return_storage_ptr__->M + 8) = CONCAT44(fVar16,fVar15);
  uVar3._0_4_ = (this->RelativeTranslation).X;
  uVar3._4_4_ = (this->RelativeTranslation).Y;
  *(undefined8 *)(__return_storage_ptr__->M + 0xc) = uVar3;
  fVar1 = (this->RelativeTranslation).Z;
  __return_storage_ptr__->M[0xe] = fVar1;
  fVar11 = (this->RelativeScale).X;
  fVar13 = (this->RelativeScale).Y;
  fVar2 = (this->RelativeScale).Z;
  if ((((fVar11 != 1.0) || (NAN(fVar11))) || (fVar13 != 1.0)) ||
     (((NAN(fVar13) || (fVar2 != 1.0)) || (NAN(fVar2))))) {
    fVar20 = (float)(undefined4)uVar3 * 0.0;
    fVar21 = (float)uVar3._4_4_ * 0.0;
    *(ulong *)__return_storage_ptr__->M =
         CONCAT44(fVar11 * fVar12 + fVar18 * 0.0 + fVar16 * 0.0 + fVar21,
                  fVar11 * fVar10 + fVar17 * 0.0 + fVar15 * 0.0 + fVar20);
    fVar23 = fVar1 * 0.0;
    __return_storage_ptr__->M[2] = fVar19 * fVar11 + fVar14 * 0.0 + fVar22 * 0.0 + fVar23;
    __return_storage_ptr__->M[3] = fVar11 * 0.0 + 0.0 + 0.0;
    *(ulong *)(__return_storage_ptr__->M + 4) =
         CONCAT44(fVar13 * fVar18 + fVar12 * 0.0 + fVar16 * 0.0 + fVar21,
                  fVar13 * fVar17 + fVar10 * 0.0 + fVar15 * 0.0 + fVar20);
    __return_storage_ptr__->M[6] = fVar14 * fVar13 + fVar19 * 0.0 + fVar22 * 0.0 + fVar23;
    __return_storage_ptr__->M[7] = fVar13 * 0.0 + 0.0;
    fVar11 = fVar10 * 0.0 + fVar17 * 0.0;
    fVar13 = fVar12 * 0.0 + fVar18 * 0.0;
    *(ulong *)(__return_storage_ptr__->M + 8) =
         CONCAT44(fVar2 * fVar16 + fVar13 + fVar21,fVar2 * fVar15 + fVar11 + fVar20);
    fVar10 = fVar19 * 0.0 + fVar14 * 0.0;
    __return_storage_ptr__->M[10] = fVar22 * fVar2 + fVar10 + fVar23;
    __return_storage_ptr__->M[0xb] = fVar2 * 0.0 + 0.0 + 0.0;
    __return_storage_ptr__->M[0xc] = (float)(undefined4)uVar3 + fVar15 * 0.0 + fVar11;
    __return_storage_ptr__->M[0xd] = (float)uVar3._4_4_ + fVar16 * 0.0 + fVar13;
    __return_storage_ptr__->M[0xe] = fVar1 + fVar22 * 0.0 + fVar10;
    __return_storage_ptr__->M[0xf] = 1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

virtual core::matrix4 getRelativeTransformation() const
	{
		core::matrix4 mat;
		mat.setRotationDegrees(RelativeRotation);
		mat.setTranslation(RelativeTranslation);

		if (RelativeScale != core::vector3df(1.f, 1.f, 1.f)) {
			core::matrix4 smat;
			smat.setScale(RelativeScale);
			mat *= smat;
		}

		return mat;
	}